

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

CSVOption<char> __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::CSVOption<char>>
          (Deserializer *this,field_id_t field_id,char *tag,CSVOption<char> default_value)

{
  CSVOption<char> CVar1;
  uint uVar2;
  type in_CX;
  undefined8 in_RDX;
  ushort in_SI;
  Deserializer *in_RDI;
  type ret;
  type local_2;
  
  uVar2 = (*in_RDI->_vptr_Deserializer[4])(in_RDI,(ulong)in_SI,in_RDX,in_SI);
  if ((uVar2 & 1) == 0) {
    (*in_RDI->_vptr_Deserializer[5])(in_RDI,0);
    local_2 = in_CX;
  }
  else {
    local_2 = Read<duckdb::CSVOption<char>>(in_RDI);
    (*in_RDI->_vptr_Deserializer[5])(in_RDI,1);
  }
  CVar1.set_by_user = local_2.set_by_user;
  CVar1.value = local_2.value;
  return CVar1;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}